

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

void __thiscall
TPZSkylMatrix<std::complex<double>_>::UpdateFrom
          (TPZSkylMatrix<std::complex<double>_> *this,
          TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *mat)

{
  TPZMatrix<std::complex<double>_> *pTVar1;
  long lVar2;
  
  pTVar1 = mat->fRef->fPointer;
  if (pTVar1 == (TPZMatrix<std::complex<double>_> *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = __dynamic_cast(pTVar1,&TPZMatrix<std::complex<double>>::typeinfo,
                           &TPZSkylMatrix<std::complex<double>>::typeinfo,0);
  }
  if (lVar2 == 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzskylmat.cpp"
               ,0x70);
  }
  if ((this->fStorage).fNElements != *(long *)(lVar2 + 0x50)) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzskylmat.cpp"
               ,0x73);
  }
  memcpy((this->fStorage).fStore,*(void **)(lVar2 + 0x48),(this->fStorage).fNElements << 4);
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed =
       *(char *)(lVar2 + 0x18);
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDefPositive =
       *(char *)(lVar2 + 0x19);
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::UpdateFrom(TPZAutoPointer<TPZMatrix<TVar> > mat)
{
    TPZMatrix<TVar> *matrix = mat.operator->();
    TPZSkylMatrix<TVar> *skylmat = dynamic_cast<TPZSkylMatrix<TVar> *>(matrix);
    if (!skylmat) {
        DebugStop();
    }
    if (fStorage.NElements() != skylmat->fStorage.NElements()) {
        DebugStop();
    }
    memcpy(&fStorage[0], &(skylmat->fStorage[0]) , fStorage.NElements()*sizeof(TVar));
    this->fDecomposed = skylmat->fDecomposed;
    this->fDefPositive = skylmat->fDefPositive;
}